

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h263d_vdpu2.c
# Opt level: O0

MPP_RET hal_vpu2_h263d_start(void *hal,HalTaskInfo *task)

{
  long lVar1;
  long local_58;
  MppDevRegRdCfg rd_cfg;
  MppDevRegWrCfg wr_cfg;
  RK_U32 i;
  RK_U32 reg_count;
  RK_U32 *regs;
  hal_h263_ctx *ctx;
  MPP_RET ret;
  HalTaskInfo *task_local;
  void *hal_local;
  
  lVar1 = *(long *)((long)hal + 0x88);
  if ((h263d_hal_debug & 1) != 0) {
    for (wr_cfg.size = 0; wr_cfg.size < 0x9f; wr_cfg.size = wr_cfg.size + 1) {
      _mpp_log_l(4,"hal_vpu_h263d","reg[%03d]: %08x\n",(char *)0x0,(ulong)wr_cfg.size,
                 (ulong)*(uint *)(lVar1 + (ulong)wr_cfg.size * 4));
    }
  }
  rd_cfg._8_8_ = lVar1;
  ctx._4_4_ = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x70),4,&rd_cfg.size);
  if (ctx._4_4_ == MPP_OK) {
    rd_cfg.reg._0_4_ = 0x27c;
    rd_cfg.reg._4_4_ = 0;
    local_58 = lVar1;
    ctx._4_4_ = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x70),5,&local_58);
    if (ctx._4_4_ == MPP_OK) {
      ctx._4_4_ = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x70),0xf,(void *)0x0);
      if (ctx._4_4_ != MPP_OK) {
        _mpp_log_l(2,"hal_vpu_h263d","send cmd failed %d\n","hal_vpu2_h263d_start",
                   (ulong)(uint)ctx._4_4_);
      }
    }
    else {
      _mpp_log_l(2,"hal_vpu_h263d","set register read failed %d\n","hal_vpu2_h263d_start",
                 (ulong)(uint)ctx._4_4_);
    }
  }
  else {
    _mpp_log_l(2,"hal_vpu_h263d","set register write failed %d\n","hal_vpu2_h263d_start",
               (ulong)(uint)ctx._4_4_);
  }
  return ctx._4_4_;
}

Assistant:

MPP_RET hal_vpu2_h263d_start(void *hal, HalTaskInfo *task)
{
    MPP_RET ret = MPP_OK;
    hal_h263_ctx *ctx = (hal_h263_ctx *)hal;
    RK_U32 *regs = (RK_U32 *)ctx->regs;

    if (h263d_hal_debug & H263D_HAL_DBG_REG_PUT) {
        RK_U32 reg_count = (sizeof(Vpu2H263dRegSet_t) / sizeof(RK_U32));
        RK_U32 i = 0;

        for (i = 0; i < reg_count; i++)
            mpp_log("reg[%03d]: %08x\n", i, regs[i]);
    }

    do {
        MppDevRegWrCfg wr_cfg;
        MppDevRegRdCfg rd_cfg;

        wr_cfg.reg = regs;
        wr_cfg.size = sizeof(Vpu2H263dRegSet_t);
        wr_cfg.offset = 0;

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        rd_cfg.reg = regs;
        rd_cfg.size = sizeof(Vpu2H263dRegSet_t);
        rd_cfg.offset = 0;

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_RD, &rd_cfg);
        if (ret) {
            mpp_err_f("set register read failed %d\n", ret);
            break;
        }

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_CMD_SEND, NULL);
        if (ret) {
            mpp_err_f("send cmd failed %d\n", ret);
            break;
        }
    } while (0);

    (void)task;
    return ret;
}